

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  basic_format_specs<char> *pbVar5;
  undefined1 auVar6 [16];
  unsigned___int128 uVar7;
  char cVar8;
  int iVar9;
  buffer_appender<char> bVar10;
  _Alloc_hider _Var11;
  uint uVar12;
  size_type sVar13;
  long lVar14;
  uint uVar15;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  buffer<char> *buf;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string groups;
  char digits [40];
  string local_2a0;
  undefined8 local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong uVar16;
  
  grouping_impl<char>(&local_2a0,(locale_ref)(this->locale).locale_);
  if (local_2a0._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar8 == '\0') {
      on_dec(this);
    }
    else {
      puVar1 = &this->abs_value;
      uVar7 = *puVar1;
      uVar21 = *(ulong *)((long)&this->abs_value + 8);
      auVar6 = (undefined1  [16])*puVar1;
      auVar23 = (undefined1  [16])*puVar1;
      local_280 = 1;
      if (((ulong)uVar7 < 10) <= uVar21) {
        local_280 = 4;
        auVar22 = auVar23;
        do {
          uVar19 = auVar22._8_8_;
          uVar16 = auVar22._0_8_;
          iVar9 = (int)local_280;
          if (uVar19 == 0 && (ulong)(99 < uVar16) <= -uVar19) {
            local_280 = (ulong)(iVar9 - 2);
            goto LAB_00132878;
          }
          if (uVar19 == 0 && (ulong)(999 < uVar16) <= -uVar19) {
            local_280 = (ulong)(iVar9 - 1);
            goto LAB_00132878;
          }
          if (uVar19 < (uVar16 < 10000)) goto LAB_00132878;
          auVar22 = __udivti3(uVar16,uVar19,10000,0);
          local_280 = (ulong)(iVar9 + 4);
        } while (uVar19 != 0 || -uVar19 < (ulong)(99999 < uVar16));
        local_280 = (ulong)(iVar9 + 1);
      }
LAB_00132878:
      pcVar18 = local_2a0._M_dataplus._M_p + local_2a0._M_string_length;
      uVar12 = (uint)local_280;
      _Var11._M_p = local_2a0._M_dataplus._M_p;
      uVar19 = local_280;
      uVar20 = uVar12;
      if (local_2a0._M_string_length != 0) {
        sVar13 = local_2a0._M_string_length;
        uVar16 = local_280;
        do {
          uVar20 = (uint)uVar16;
          cVar3 = *_Var11._M_p;
          uVar15 = uVar20 - (int)cVar3;
          uVar16 = (ulong)uVar15;
          if ((uVar15 == 0 || (int)uVar20 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
          goto LAB_001328c7;
          uVar19 = (ulong)((int)uVar19 + 1);
          _Var11._M_p = _Var11._M_p + 1;
          sVar13 = sVar13 - 1;
        } while (sVar13 != 0);
        _Var11._M_p = pcVar18;
        uVar19 = (ulong)(uVar12 + (int)local_2a0._M_string_length);
        uVar20 = uVar15;
      }
LAB_001328c7:
      iVar9 = (int)uVar19;
      if (_Var11._M_p == pcVar18) {
        iVar9 = (int)(uVar20 - 1) / (int)pcVar18[-1] + iVar9;
      }
      pcVar18 = local_278 + (int)uVar12;
      pcVar17 = pcVar18;
      if (((ulong)uVar7 < 100) <= uVar21) {
        do {
          lVar14 = auVar23._8_8_;
          uVar21 = auVar23._0_8_;
          pcVar18 = pcVar17 + -2;
          auVar23 = __udivti3(uVar21,lVar14,100,0);
          *(undefined2 *)(pcVar17 + -2) =
               *(undefined2 *)(&basic_data<void>::digits + (uVar21 + auVar23._0_8_ * -100) * 2);
          pcVar17 = pcVar18;
          auVar6 = auVar23;
        } while (lVar14 != 0 || (ulong)-lVar14 < (ulong)(9999 < uVar21));
      }
      if (auVar6._8_8_ == 0 && (ulong)(9 < auVar6._0_8_) <= (ulong)-auVar6._8_8_) {
        pcVar18[-1] = auVar6[0] | 0x30;
      }
      else {
        *(undefined2 *)(pcVar18 + -2) =
             *(undefined2 *)(&basic_data<void>::digits + auVar6._0_8_ * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014acc8;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar20 = iVar9 + this->prefix_size;
      uVar21 = (ulong)uVar20;
      if (500 < uVar20) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar21);
      }
      pcVar18 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar21 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar21;
      }
      pcVar17 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar20 + -1;
      if (1 < (int)local_280) {
        lVar14 = (local_280 & 0xffffffff) + 1;
        iVar9 = 0;
        _Var11._M_p = local_2a0._M_dataplus._M_p;
        do {
          pcVar2 = pcVar17 + -1;
          *pcVar17 = local_278[lVar14 + -2];
          cVar3 = *_Var11._M_p;
          if ('\0' < cVar3) {
            iVar9 = iVar9 + 1;
            if ((cVar3 != '\x7f') && (iVar9 % (int)cVar3 == 0)) {
              if (_Var11._M_p + 1 != local_2a0._M_dataplus._M_p + local_2a0._M_string_length) {
                iVar9 = 0;
                _Var11._M_p = _Var11._M_p + 1;
              }
              pcVar17[-1] = cVar8;
              pcVar2 = pcVar17 + -2;
            }
          }
          pcVar17 = pcVar2;
          lVar14 = lVar14 + -1;
        } while (2 < lVar14);
      }
      *pcVar17 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar17[-1] = '-';
      }
      pbVar5 = this->specs;
      uVar19 = 0;
      if (uVar21 <= (uint)pbVar5->width) {
        uVar19 = (uint)pbVar5->width - uVar21;
      }
      bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar21 + (pbVar5->fill).size_ * uVar19) {
        (*(code *)**(undefined8 **)
                    bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar21 = uVar19 >> (bVar4 & 0x3f);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar21,&pbVar5->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar18,pcVar18 + (int)uVar20,bVar10);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar10,uVar19 - uVar21,&pbVar5->fill);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }